

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  cmMakefile *pcVar1;
  ArtifactType artifact_00;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  char *pcVar5;
  char *__lhs;
  string *psVar6;
  allocator<char> local_e9;
  char *local_e8;
  string ll;
  string fw_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ArtifactType local_74;
  string *local_70;
  ArtifactType local_64;
  char *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  TVar3 = this->Target->TargetTypeValue;
  if (TVar3 < OBJECT_LIBRARY) {
    local_70 = config;
    if (artifact == ImportLibraryArtifact) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&fw_prefix);
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&ll);
      std::__cxx11::string::~string((string *)&ll);
      if (pcVar4 == (char *)0x0) {
        outPrefix->_M_string_length = 0;
        *(outPrefix->_M_dataplus)._M_p = '\0';
        outBase->_M_string_length = 0;
        *(outBase->_M_dataplus)._M_p = '\0';
        outSuffix->_M_string_length = 0;
        *(outSuffix->_M_dataplus)._M_p = '\0';
        return;
      }
      TVar3 = this->Target->TargetTypeValue;
    }
    psVar6 = local_70;
    local_74 = RuntimeBinaryArtifact;
    if ((TVar3 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      local_74 = artifact;
    }
    if (TVar3 == EXECUTABLE) {
      local_74 = artifact;
    }
    if (artifact == ImportLibraryArtifact) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"IMPORT_PREFIX",(allocator<char> *)&fw_prefix);
      pcVar4 = GetProperty(this,&ll);
      std::__cxx11::string::~string((string *)&ll);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"IMPORT_SUFFIX",(allocator<char> *)&fw_prefix);
      local_e8 = GetProperty(this,&ll);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"PREFIX",(allocator<char> *)&fw_prefix);
      pcVar4 = GetProperty(this,&ll);
      std::__cxx11::string::~string((string *)&ll);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ll,"SUFFIX",(allocator<char> *)&fw_prefix);
      local_e8 = GetProperty(this,&ll);
    }
    std::__cxx11::string::~string((string *)&ll);
    local_64 = artifact;
    local_38 = outSuffix;
    if (psVar6->_M_string_length == 0) {
      local_60 = (char *)0x0;
    }
    else {
      cmsys::SystemTools::UpperCase(&ll,psVar6);
      std::__cxx11::string::append((char *)&ll);
      pcVar5 = GetProperty(this,&ll);
      if (((pcVar5 == (char *)0x0) || (bVar2 = IsAppBundleOnApple(this), bVar2)) ||
         (bVar2 = IsFrameworkOnApple(this), bVar2)) {
        pcVar5 = (char *)0x0;
      }
      local_60 = pcVar5;
      std::__cxx11::string::~string((string *)&ll);
    }
    artifact_00 = local_74;
    pcVar5 = cmTarget::GetPrefixVariableInternal(this->Target,local_74);
    __lhs = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
    GetLinkerLanguage(&ll,this,local_70);
    if (ll._M_string_length != 0) {
      if ((local_e8 == (char *)0x0) && (__lhs != (char *)0x0)) {
        if (*__lhs == '\0') {
          local_e8 = (char *)0x0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"_",&local_e9);
          std::operator+(&local_98,__lhs,&local_58);
          std::operator+(&fw_prefix,&local_98,&ll);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_58);
          local_e8 = cmMakefile::GetDefinition(this->Makefile,&fw_prefix);
          std::__cxx11::string::~string((string *)&fw_prefix);
        }
      }
      if ((pcVar4 == (char *)0x0) && (pcVar5 != (char *)0x0)) {
        if (*pcVar5 == '\0') {
          pcVar4 = (char *)0x0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"_",&local_e9);
          std::operator+(&local_98,pcVar5,&local_58);
          std::operator+(&fw_prefix,&local_98,&ll);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_58);
          pcVar4 = cmMakefile::GetDefinition(this->Makefile,&fw_prefix);
          std::__cxx11::string::~string((string *)&fw_prefix);
        }
      }
    }
    if ((pcVar5 != (char *)0x0) && (pcVar4 == (char *)0x0)) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fw_prefix,pcVar5,(allocator<char> *)&local_98);
      cmMakefile::GetSafeDefinition(pcVar1,&fw_prefix);
      std::__cxx11::string::~string((string *)&fw_prefix);
    }
    if ((__lhs != (char *)0x0) && (local_e8 == (char *)0x0)) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fw_prefix,__lhs,(allocator<char> *)&local_98);
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&fw_prefix);
      local_e8 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::~string((string *)&fw_prefix);
    }
    fw_prefix._M_dataplus._M_p = (pointer)&fw_prefix.field_2;
    fw_prefix._M_string_length = 0;
    fw_prefix.field_2._M_local_buf[0] = '\0';
    bVar2 = IsFrameworkOnApple(this);
    psVar6 = local_70;
    if (bVar2) {
      GetFrameworkDirectory(&local_98,this,local_70,ContentLevel);
      std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::append((char *)&fw_prefix);
      local_e8 = (char *)0x0;
    }
    bVar2 = IsCFBundleOnApple(this);
    if (bVar2) {
      GetCFBundleDirectory(&local_98,this,psVar6,FullLevel);
      std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::append((char *)&fw_prefix);
      local_e8 = (char *)0x0;
    }
    std::__cxx11::string::assign((char *)outPrefix);
    GetOutputName(&local_98,this,psVar6,local_74);
    std::__cxx11::string::append((string *)outBase);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((char *)outBase);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"SOVERSION",(allocator<char> *)&local_58);
    pcVar4 = GetProperty(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (((pcVar4 != (char *)0x0) && (local_64 != ImportLibraryArtifact)) &&
       (this->Target->TargetTypeValue == SHARED_LIBRARY)) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",
                 (allocator<char> *)&local_58);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (bVar2) {
        std::__cxx11::string::append((char *)outBase);
        std::__cxx11::string::append((char *)outBase);
      }
    }
    std::__cxx11::string::assign((char *)local_38);
    std::__cxx11::string::~string((string *)&fw_prefix);
    std::__cxx11::string::~string((string *)&ll);
  }
  else {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::_M_assign((string *)outBase);
    outSuffix->_M_string_length = 0;
    *(outSuffix->_M_dataplus)._M_p = '\0';
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = nullptr;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar).c_str();
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar).c_str();
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}